

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_unpack4x8_instruction(Impl *impl,CallInst *instruction)

{
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  Operation *pOVar4;
  Value *value;
  Type *pTVar5;
  Op op;
  Operation *expand_op;
  Id result_type;
  Type *element_type;
  Operation *pOStack_30;
  uint32_t signed_expand;
  Operation *bitcast_op;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  bitcast_op = (Operation *)Converter::Impl::builder(impl);
  spv::Builder::addCapability((Builder *)bitcast_op,CapabilityInt8);
  pCVar1 = instruction_local;
  pOVar4 = bitcast_op;
  IVar3 = spv::Builder::makeUintType((Builder *)bitcast_op,8);
  IVar3 = spv::Builder::makeVectorType((Builder *)pOVar4,IVar3,4);
  pOVar4 = Converter::Impl::allocate((Impl *)pCVar1,OpBitcast,IVar3);
  pCVar1 = instruction_local;
  pOStack_30 = pOVar4;
  value = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
  IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,value,0);
  Operation::add_id(pOVar4,IVar3);
  Converter::Impl::add((Impl *)instruction_local,pOStack_30,false);
  bVar2 = get_constant_operand((Instruction *)builder,1,(uint32_t *)((long)&element_type + 4));
  if (bVar2) {
    pTVar5 = LLVMBC::Value::getType((Value *)builder);
    pTVar5 = LLVMBC::Type::getStructElementType(pTVar5,0);
    pOVar4 = bitcast_op;
    IVar3 = Converter::Impl::get_type_id((Impl *)instruction_local,pTVar5,0);
    IVar3 = spv::Builder::makeVectorType((Builder *)pOVar4,IVar3,4);
    op = OpUConvert;
    if (element_type._4_4_ != 0) {
      op = OpSConvert;
    }
    pOVar4 = Converter::Impl::allocate((Impl *)instruction_local,op,(Value *)builder,IVar3);
    Operation::add_id(pOVar4,pOStack_30->id);
    Converter::Impl::add((Impl *)instruction_local,pOVar4,false);
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_unpack4x8_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityInt8);

	auto *bitcast_op = impl.allocate(spv::OpBitcast, builder.makeVectorType(builder.makeUintType(8), 4));
	bitcast_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
	impl.add(bitcast_op);

	uint32_t signed_expand;
	if (!get_constant_operand(instruction, 1, &signed_expand))
		return false;

	auto *element_type = instruction->getType()->getStructElementType(0);
	spv::Id result_type = builder.makeVectorType(impl.get_type_id(element_type), 4);

	auto *expand_op = impl.allocate(signed_expand ? spv::OpSConvert : spv::OpUConvert,
	                                instruction, result_type);
	expand_op->add_id(bitcast_op->id);
	impl.add(expand_op);

	return true;
}